

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::UnitTestMisbehaving
          (PeerManagerImpl *this,NodeId peer_id)

{
  string_view assertion;
  string *message;
  PeerManagerImpl *this_00;
  long in_FS_OFFSET;
  string_view file;
  string_view func;
  allocator<char> local_41;
  undefined1 local_40 [16];
  uint64_t local_30;
  char *pcStack_28;
  undefined8 local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  GetPeerRef((PeerManagerImpl *)local_40,(NodeId)this);
  this_00 = (PeerManagerImpl *)local_40._0_8_;
  if ((PeerManagerImpl *)local_40._0_8_ == (PeerManagerImpl *)0x0) {
    local_30 = 0x13;
    pcStack_28 = "GetPeerRef(peer_id)";
    assertion._M_str = "GetPeerRef(peer_id)";
    assertion._M_len = 0x13;
    file._M_str = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    file._M_len = 0x62;
    func._M_str = "UnitTestMisbehaving";
    func._M_len = 0x13;
    assertion_fail(file,0x20e,func,assertion);
    this_00 = (PeerManagerImpl *)local_40._0_8_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffd0,"",&local_41);
  Misbehaving(this_00,(Peer *)&stack0xffffffffffffffd0,message);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_peer_mutex) { Misbehaving(*Assert(GetPeerRef(peer_id)), ""); }